

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

ScriptContext * __thiscall
TTD::ThreadContextTTD::LookupContextForScriptId(ThreadContextTTD *this,TTD_LOG_PTR_ID ctxId)

{
  int iVar1;
  ScriptContext **ppSVar2;
  int local_24;
  int i;
  TTD_LOG_PTR_ID ctxId_local;
  ThreadContextTTD *this_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::Count
                      (&(this->m_contextList).
                        super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                      );
    if (iVar1 <= local_24) {
      return (ScriptContext *)0x0;
    }
    ppSVar2 = JsUtil::
              List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(&this->m_contextList,local_24);
    if ((*ppSVar2)->ScriptContextLogTag == ctxId) break;
    local_24 = local_24 + 1;
  }
  ppSVar2 = JsUtil::
            List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item(&this->m_contextList,local_24);
  return *ppSVar2;
}

Assistant:

Js::ScriptContext* ThreadContextTTD::LookupContextForScriptId(TTD_LOG_PTR_ID ctxId) const
    {
        for(int i = 0; i < this->m_contextList.Count(); ++i)
        {
            if(this->m_contextList.Item(i)->ScriptContextLogTag == ctxId)
            {
                return this->m_contextList.Item(i);
            }
        }

        return nullptr;
    }